

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vampire.cpp
# Opt level: O2

Problem * doProving(Problem *problem)

{
  Options *unaff_RBX;
  Options *unaff_retaddr;
  Property *in_stack_00000008;
  Options *in_stack_00000010;
  string *in_stack_00000098;
  Options *in_stack_00000170;
  
  if ((Lib::env->_sampleStrategy).
      super_OptionValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .actualValue._M_string_length != 0) {
    Shell::Options::sampleStrategy(in_stack_00000170,in_stack_00000098);
  }
  Shell::Options::setForcedOptionValues(unaff_RBX);
  Shell::Options::checkGlobalOptionConstraints(unaff_retaddr,false);
  preprocessProblem(problem);
  if ((Lib::env->_mode).super_OptionValue<Shell::Options::Mode>.actualValue != SPIDER) {
    Kernel::Problem::getProperty(problem);
    Shell::Options::checkProblemOptionConstraints(in_stack_00000010,in_stack_00000008,false,false);
  }
  Saturation::ProvingHelper::runVampireSaturation(problem,Lib::env);
  return problem;
}

Assistant:

[[nodiscard]]
Problem *doProving(Problem* problem)
{
  // a new strategy randomization mechanism
  if (!env.options->strategySamplerFilename().empty()) {
    env.options->sampleStrategy(env.options->strategySamplerFilename());
  }

  env.options->setForcedOptionValues();
  env.options->checkGlobalOptionConstraints();

  Problem *prb = preprocessProblem(problem);

  // this will provide warning if options don't make sense for problem
  if (env.options->mode()!=Options::Mode::SPIDER) {
    env.options->checkProblemOptionConstraints(prb->getProperty(), /*before_preprocessing = */ false);
  }

  ProvingHelper::runVampireSaturation(*prb, *env.options);
  return prb;
}